

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

uint32_t __thiscall
ddd::DaTrie<true,_true,_false>::excheck_in_block_
          (DaTrie<true,_true,_false> *this,Edge *edge,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  bool bVar2;
  uint base;
  uint32_t uVar3;
  
  uVar1 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
          super__Vector_impl_data._M_start[block_pos].head;
  uVar3 = uVar1;
  do {
    base = edge->labels_[0] ^ uVar3;
    bVar2 = is_target_ex_(this,base,edge);
    if (bVar2) {
      return base;
    }
    uVar3 = *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar3) & 0x7fffffff;
  } while (uVar3 != uVar1);
  return 0xffffffff;
}

Assistant:

uint32_t excheck_in_block_(const Edge& edge, uint32_t block_pos,
                             const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    auto head = blocks[block_pos].head;
    auto node_pos = head;

    do {
      auto base = node_pos ^*edge.begin();
      if (is_target_ex_(base, edge)) {
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head);

    return NOT_FOUND;
  }